

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zz_mul.c
# Opt level: O0

word zzSubMulW(word *b,word *a,size_t n,word w)

{
  ulong uVar1;
  ulong uVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  long lVar5;
  ulong uVar6;
  size_t i;
  dword prod;
  word borrow;
  word w_local;
  size_t n_local;
  word *a_local;
  word *b_local;
  
  borrow = 0;
  for (i = 0; i < n; i = i + 1) {
    auVar3._8_8_ = 0;
    auVar3._0_8_ = w;
    auVar4._8_8_ = 0;
    auVar4._0_8_ = a[i];
    lVar5 = SUB168(auVar3 * auVar4,0);
    uVar1 = -lVar5;
    uVar2 = b[i];
    uVar6 = uVar1 + uVar2;
    b[i] = uVar6 - borrow;
    borrow = -(((-(ulong)(lVar5 != 0) - SUB168(auVar3 * auVar4,8)) + (ulong)CARRY8(uVar1,uVar2)) -
              (ulong)(uVar6 < borrow));
  }
  return borrow;
}

Assistant:

word zzSubMulW(word b[], const word a[], size_t n, register word w)
{
	register word borrow = 0;
	register dword prod;
	size_t i;
	ASSERT(wwIsSameOrDisjoint(a, b, n));
	for (i = 0; i < n; ++i)
	{
		zzMul11(prod, w, a[i]);
		prod = (dword)0 - prod;
		prod += b[i];
		prod -= borrow;
		b[i] = (word)prod;
		borrow = WORD_0 - (word)(prod >> B_PER_W);
	}
	prod = 0, w = 0;
	return borrow;
}